

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UCharsTrieElement::getString
          (UnicodeString *__return_storage_ptr__,UCharsTrieElement *this,UnicodeString *strings)

{
  char16_t cVar1;
  int32_t length;
  UnicodeString *strings_local;
  UCharsTrieElement *this_local;
  
  cVar1 = UnicodeString::operator[](strings,this->stringOffset);
  UnicodeString::tempSubString
            (__return_storage_ptr__,strings,this->stringOffset + 1,(uint)(ushort)cVar1);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString getString(const UnicodeString &strings) const {
        int32_t length=strings[stringOffset];
        return strings.tempSubString(stringOffset+1, length);
    }